

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve3right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y2,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *b,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rhs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rhs2)

{
  uint uVar1;
  int rn;
  int *ridx;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  pointer pnVar6;
  pointer pnVar7;
  pointer pnVar8;
  int *piVar9;
  pointer pnVar10;
  Real val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar11 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3_00;
  int iVar12;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  uint *puVar18;
  byte bVar19;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffbac;
  undefined8 in_stack_fffffffffffffbc8;
  int iVar20;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 local_3d0;
  undefined4 uStack_3c8;
  int f;
  undefined1 local_3c0 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_330 [28];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  uint local_230 [28];
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar21;
  
  bVar19 = 0;
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar12 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar2 = (rhs->super_IdxSet).idx;
  uVar1 = (rhs2->super_IdxSet).num;
  eps3_00.m_backend.data._M_elems[1] = 0;
  eps3_00.m_backend.data._M_elems[0] = uVar1;
  rhs2->setupStatus = false;
  piVar3 = (rhs2->super_IdxSet).idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_3c0,
             &(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon((Tolerances *)local_3c0._0_8_);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3c0 + 8));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  pVVar21 = y2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y2);
  iVar20 = (int)pVVar21;
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    rn = (this->ssvec).super_IdxSet.num;
    lVar13 = 0x1c;
    pnVar15 = &epsilon;
    pnVar17 = &local_2b0;
    for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = epsilon.m_backend.exp;
    local_2b0.m_backend.neg = epsilon.m_backend.neg;
    local_2b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_2b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (x->super_IdxSet).idx;
    pnVar15 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar17 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &epsilon;
    puVar18 = local_b0;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar18 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    local_40 = epsilon.m_backend.exp;
    local_3c = epsilon.m_backend.neg;
    local_38 = epsilon.m_backend.fpclass;
    local_34 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar6 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &epsilon;
    puVar18 = local_130;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar18 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    auVar11 = ZEXT7296(CONCAT468(in_stack_fffffffffffffbac,
                                 CONCAT464(uVar1,CONCAT856(piVar3,CONCAT848((rhs2->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  CONCAT840(local_130,
                                                            CONCAT832(pnVar6,CONCAT428(
                                                  in_stack_fffffffffffffb84,
                                                  CONCAT424(iVar12,CONCAT816(piVar2,CONCAT88(pnVar7,
                                                  local_b0)))))))))));
    eps2_00.m_backend.data._M_elems[0x18] = (int)in_stack_fffffffffffffbc8;
    eps2_00.m_backend.data._M_elems[0x19] = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    eps2_00.m_backend.data._M_elems[0] = auVar11._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar11._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar11._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar11._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar11._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar11._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar11._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar11._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar11._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar11._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar11._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar11._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar11._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar11._52_4_;
    eps2_00.m_backend.data._M_elems[0xe] = auVar11._56_4_;
    eps2_00.m_backend.data._M_elems[0xf] = auVar11._60_4_;
    eps2_00.m_backend.data._M_elems[0x10] = auVar11._64_4_;
    eps2_00.m_backend.data._M_elems[0x11] = auVar11._68_4_;
    eps2_00.m_backend.data._M_elems[0x12] = auVar11._72_4_;
    eps2_00.m_backend.data._M_elems[0x13] = auVar11._76_4_;
    eps2_00.m_backend.data._M_elems[0x14] = auVar11._80_4_;
    eps2_00.m_backend.data._M_elems[0x15] = auVar11._84_4_;
    eps2_00.m_backend.data._M_elems[0x16] = auVar11._88_4_;
    eps2_00.m_backend.data._M_elems[0x17] = auVar11._92_4_;
    eps2_00.m_backend.data._M_elems[0x1a] = rn;
    eps2_00.m_backend.data._M_elems[0x1b] = (int)((ulong)b >> 0x20);
    eps2_00.m_backend._112_8_ = pnVar5;
    eps2_00.m_backend._120_8_ = pnVar17;
    eps3_00.m_backend.data._M_elems._8_8_ = piVar3;
    eps3_00.m_backend.data._M_elems._16_8_ = ridx;
    eps3_00.m_backend.data._M_elems._24_8_ = piVar2;
    eps3_00.m_backend.data._M_elems[8] = iVar12;
    eps3_00.m_backend.data._M_elems[9] = 0;
    eps3_00.m_backend.data._M_elems._40_8_ = local_3d0;
    eps3_00.m_backend.data._M_elems[0xc] = uStack_3c8;
    eps3_00.m_backend.data._M_elems[0xd] = f;
    eps3_00.m_backend.data._M_elems[0xe] = local_3c0._0_4_;
    eps3_00.m_backend.data._M_elems[0xf] = local_3c0._4_4_;
    eps3_00.m_backend.data._M_elems[0x10] = local_3c0._8_4_;
    eps3_00.m_backend.data._M_elems[0x11] = local_3c0._12_4_;
    eps3_00.m_backend.data._M_elems[0x12] = epsilon.m_backend.data._M_elems[0];
    eps3_00.m_backend.data._M_elems[0x13] = epsilon.m_backend.data._M_elems[1];
    eps3_00.m_backend.data._M_elems[0x14] = epsilon.m_backend.data._M_elems[2];
    eps3_00.m_backend.data._M_elems[0x15] = epsilon.m_backend.data._M_elems[3];
    eps3_00.m_backend.data._M_elems[0x16] = epsilon.m_backend.data._M_elems[4];
    eps3_00.m_backend.data._M_elems[0x17] = epsilon.m_backend.data._M_elems[5];
    eps3_00.m_backend.data._M_elems[0x18] = epsilon.m_backend.data._M_elems[6];
    eps3_00.m_backend.data._M_elems[0x19] = epsilon.m_backend.data._M_elems[7];
    eps3_00.m_backend.data._M_elems[0x1a] = epsilon.m_backend.data._M_elems[8];
    eps3_00.m_backend.data._M_elems[0x1b] = epsilon.m_backend.data._M_elems[9];
    eps3_00.m_backend.exp = epsilon.m_backend.data._M_elems[10];
    eps3_00.m_backend.neg = (bool)(undefined1)epsilon.m_backend.data._M_elems[0xb];
    eps3_00.m_backend._117_3_ = epsilon.m_backend.data._M_elems[0xb]._1_3_;
    eps3_00.m_backend.fpclass = epsilon.m_backend.data._M_elems[0xc];
    eps3_00.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xd];
    iVar12 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_2b0,pnVar15,piVar4,pnVar17,ridx,rn,pnVar5,eps2_00,pnVar15,
                        piVar4,iVar20,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)this_00,eps3_00,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._56_8_,
                        (int *)epsilon.m_backend.data._M_elems._64_8_,
                        epsilon.m_backend.data._M_elems[0x12],
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._80_8_,
                        (int *)epsilon.m_backend.data._M_elems._88_8_,
                        (int *)epsilon.m_backend.data._M_elems._96_8_);
    (x->super_IdxSet).num = iVar12;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar20 = (this->ssvec).super_IdxSet.num;
    pnVar15 = &epsilon;
    pnVar17 = &local_1b0;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = epsilon.m_backend.exp;
    local_1b0.m_backend.neg = epsilon.m_backend.neg;
    local_1b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_1b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar4 = (x->super_IdxSet).idx;
    pnVar15 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar17 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &epsilon;
    puVar18 = local_330;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar18 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    local_2c0 = epsilon.m_backend.exp;
    local_2bc = epsilon.m_backend.neg;
    local_2b8 = epsilon.m_backend.fpclass;
    local_2b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar6 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar7 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &epsilon;
    puVar18 = local_230;
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar18 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
    }
    local_1c0 = epsilon.m_backend.exp;
    local_1bc = epsilon.m_backend.neg;
    local_1b8 = epsilon.m_backend.fpclass;
    local_1b4 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    pnVar8 = (rhs2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar9 = (this->forest).super_IdxSet.idx;
    pnVar10 = (this->forest).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar7;
    eps2.m_backend.data._M_elems._0_8_ = local_330;
    eps2.m_backend.data._M_elems._16_8_ = piVar2;
    eps2.m_backend.data._M_elems[6] = iVar12;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ = pnVar6;
    eps2.m_backend.data._M_elems._40_8_ = local_230;
    eps2.m_backend.data._M_elems._48_8_ = pnVar8;
    eps2.m_backend.data._M_elems._56_8_ = piVar3;
    eps2.m_backend.data._M_elems[0x10] = uVar1;
    eps2.m_backend.data._M_elems[0x11] = 0;
    eps2.m_backend.data._M_elems._72_8_ = pnVar10;
    eps2.m_backend.data._M_elems._80_8_ = &f;
    eps2.m_backend.data._M_elems._88_8_ = piVar9;
    eps2.m_backend.data._M_elems[0x18] = (int)in_stack_fffffffffffffbc8;
    eps2.m_backend.data._M_elems[0x19] = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
    eps2.m_backend.data._M_elems[0x1a] = iVar20;
    eps2.m_backend.data._M_elems[0x1b] = 0;
    eps2.m_backend._112_8_ = pnVar15;
    eps2.m_backend._120_8_ = pnVar6;
    eps3.m_backend.data._M_elems._8_8_ = piVar3;
    eps3.m_backend.data._M_elems[0] = uVar1;
    eps3.m_backend.data._M_elems[1] = 0;
    eps3.m_backend.data._M_elems._16_8_ = ridx;
    eps3.m_backend.data._M_elems._24_8_ = piVar2;
    eps3.m_backend.data._M_elems[8] = iVar12;
    eps3.m_backend.data._M_elems[9] = 0;
    eps3.m_backend.data._M_elems._40_8_ = pnVar17;
    eps3.m_backend.data._M_elems[0xc] = uStack_3c8;
    eps3.m_backend.data._M_elems[0xd] = f;
    eps3.m_backend.data._M_elems[0xe] = local_3c0._0_4_;
    eps3.m_backend.data._M_elems[0xf] = local_3c0._4_4_;
    eps3.m_backend.data._M_elems[0x10] = local_3c0._8_4_;
    eps3.m_backend.data._M_elems[0x11] = local_3c0._12_4_;
    eps3.m_backend.data._M_elems[0x12] = epsilon.m_backend.data._M_elems[0];
    eps3.m_backend.data._M_elems[0x13] = epsilon.m_backend.data._M_elems[1];
    eps3.m_backend.data._M_elems[0x14] = epsilon.m_backend.data._M_elems[2];
    eps3.m_backend.data._M_elems[0x15] = epsilon.m_backend.data._M_elems[3];
    eps3.m_backend.data._M_elems[0x16] = epsilon.m_backend.data._M_elems[4];
    eps3.m_backend.data._M_elems[0x17] = epsilon.m_backend.data._M_elems[5];
    eps3.m_backend.data._M_elems[0x18] = epsilon.m_backend.data._M_elems[6];
    eps3.m_backend.data._M_elems[0x19] = epsilon.m_backend.data._M_elems[7];
    eps3.m_backend.data._M_elems[0x1a] = epsilon.m_backend.data._M_elems[8];
    eps3.m_backend.data._M_elems[0x1b] = epsilon.m_backend.data._M_elems[9];
    eps3.m_backend.exp = epsilon.m_backend.data._M_elems[10];
    eps3.m_backend.neg = (bool)(undefined1)epsilon.m_backend.data._M_elems[0xb];
    eps3.m_backend._117_3_ = epsilon.m_backend.data._M_elems[0xb]._1_3_;
    eps3.m_backend.fpclass = epsilon.m_backend.data._M_elems[0xc];
    eps3.m_backend.prec_elem = epsilon.m_backend.data._M_elems[0xd];
    iVar12 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (this_00,&local_1b0,pnVar15,piVar4,pnVar17,ridx,iVar20,pnVar5,eps2,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)piVar4,(int *)pnVar5,(int)pnVar7,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)this_00,eps3,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._56_8_,
                        (int *)epsilon.m_backend.data._M_elems._64_8_,
                        epsilon.m_backend.data._M_elems[0x12],
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._80_8_,
                        (int *)epsilon.m_backend.data._M_elems._88_8_,
                        (int *)epsilon.m_backend.data._M_elems._96_8_);
    (x->super_IdxSet).num = iVar12;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}